

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

HitCounter * __thiscall
el::base::utils::RegistryWithPred<el::base::HitCounter,el::base::HitCounter::Predicate>::
get<char_const*,unsigned_long>
          (RegistryWithPred<el::base::HitCounter,el::base::HitCounter::Predicate> *this,char **arg1,
          unsigned_long arg2)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  long lVar3;
  __normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  _Var4;
  HitCounter *pHVar5;
  
  puVar2 = (undefined8 *)(**(code **)(*(long *)this + 0x58))();
  uVar1 = *puVar2;
  lVar3 = (**(code **)(*(long *)this + 0x58))(this);
  _Var4 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<el::base::HitCounter**,std::vector<el::base::HitCounter*,std::allocator<el::base::HitCounter*>>>,__gnu_cxx::__ops::_Iter_pred<el::base::HitCounter::Predicate>>
                    (uVar1,*(undefined8 *)(lVar3 + 8),*arg1,arg2);
  lVar3 = (**(code **)(*(long *)this + 0x58))(this);
  if (_Var4._M_current == *(HitCounter ***)(lVar3 + 8)) {
    pHVar5 = (HitCounter *)0x0;
  }
  else {
    pHVar5 = *_Var4._M_current;
  }
  return pHVar5;
}

Assistant:

T_Ptr* get(const T& arg1, const T2 arg2) {
    iterator iter = std::find_if(this->list().begin(), this->list().end(), Pred(arg1, arg2));
    if (iter != this->list().end() && *iter != nullptr) {
      return *iter;
    }
    return nullptr;
  }